

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O0

pipe_descriptor __thiscall
anon_unknown.dwarf_dd61e::open_fifo(anon_unknown_dwarf_dd61e *this,czstring path,int flags)

{
  value_type vVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  _Quoted_string<const_char_*,_char> _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458 [36];
  errno_erc local_434;
  _Quoted_string<const_char_*,_char> local_430;
  _Quoted_string<const_char_*,_char> local_420;
  ostringstream local_410 [8];
  ostringstream str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290 [4];
  int errcode_1;
  errno_erc local_26c;
  _Quoted_string<const_char_*,_char> local_268;
  _Quoted_string<const_char_*,_char> local_258 [2];
  ostringstream local_238 [8];
  ostringstream str;
  undefined1 local_b8 [4];
  int errcode;
  stat buf;
  int flags_local;
  czstring path_local;
  pipe_descriptor *pipe;
  
  open(path,flags | 0x800);
  pstore::details::descriptor<pstore::details::posix_descriptor_traits>::descriptor
            ((descriptor<pstore::details::posix_descriptor_traits> *)this);
  vVar1 = pstore::details::descriptor<pstore::details::posix_descriptor_traits>::native_handle
                    ((descriptor<pstore::details::posix_descriptor_traits> *)this);
  if (-1 < vVar1) {
    memset(local_b8,0,0x90);
    vVar1 = pstore::details::descriptor<pstore::details::posix_descriptor_traits>::native_handle
                      ((descriptor<pstore::details::posix_descriptor_traits> *)this);
    iVar2 = fstat(vVar1,(stat *)local_b8);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      std::__cxx11::ostringstream::ostringstream(local_238);
      poVar4 = std::operator<<((ostream *)local_238,"Could not stat the file at ");
      _Var6 = pstore::quoted(path);
      local_258[0]._M_string = _Var6._M_string;
      local_268._8_2_ = _Var6._8_2_;
      local_258[0]._M_delim = local_268._M_delim;
      local_258[0]._M_escape = local_268._M_escape;
      local_268 = _Var6;
      std::__detail::operator<<(poVar4,local_258);
      pstore::errno_erc::errno_erc(&local_26c,iVar2);
      std::__cxx11::ostringstream::str();
      pstore::raise<pstore::errno_erc,std::__cxx11::string>(local_26c,local_290);
    }
    if (((uint)buf.st_nlink & 0xf000) != 0x1000) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      std::__cxx11::ostringstream::ostringstream(local_410);
      poVar4 = std::operator<<((ostream *)local_410,"The file at ");
      _Var6 = pstore::quoted(path);
      local_420._M_string = _Var6._M_string;
      local_430._8_2_ = _Var6._8_2_;
      local_420._M_delim = local_430._M_delim;
      local_420._M_escape = local_430._M_escape;
      local_430 = _Var6;
      pbVar5 = std::__detail::operator<<(poVar4,&local_420);
      std::operator<<(pbVar5," was not a FIFO");
      pstore::errno_erc::errno_erc(&local_434,iVar2);
      std::__cxx11::ostringstream::str();
      pstore::raise<pstore::errno_erc,std::__cxx11::string>(local_434,local_458);
    }
  }
  return (pipe_descriptor)this;
}

Assistant:

pstore::pipe_descriptor open_fifo (pstore::gsl::czstring const path, int const flags) {
        pstore::pipe_descriptor pipe{::open (path, flags | O_NONBLOCK)};
        if (pipe.native_handle () < 0) {
            return pipe;
        }
        // If the file open succeeded. We check whether it's a FIFO.
        struct stat buf {};
        if (::fstat (pipe.native_handle (), &buf) != 0) {
            int const errcode = errno;
            std::ostringstream str;
            str << "Could not stat the file at " << pstore::quoted (path);
            raise (pstore::errno_erc{errcode}, str.str ());
        }
        if (!S_ISFIFO (buf.st_mode)) { //! OCLINT
            int const errcode = errno;
            std::ostringstream str;
            str << "The file at " << pstore::quoted (path) << " was not a FIFO";
            raise (pstore::errno_erc{errcode}, str.str ());
        }
        return pipe;
    }